

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16663::FileSystemTest_testRecursiveRemoval_Test::TestBody
          (FileSystemTest_testRecursiveRemoval_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  pointer pFVar5;
  int *rhs;
  __mode_t _Var6;
  char *in_R9;
  AssertHelper local_918;
  Message local_910;
  int local_904;
  undefined1 local_900 [8];
  AssertionResult gtest_ar_1;
  Message local_8e8;
  int local_8e0 [2];
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar;
  StatStruct statbuf;
  AssertHelper local_818;
  Message local_810;
  undefined1 local_808 [8];
  AssertionResult gtest_ar__2;
  string local_7f0 [39];
  bool local_7c9;
  bool result;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  AssertHelper local_7a0;
  Message local_798;
  bool local_789;
  undefined1 local_788 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_768 [8];
  raw_fd_ostream os_1;
  error_code ec_1;
  Twine local_6f0;
  Twine local_6d8;
  Twine local_6c0;
  Twine local_6a8;
  Twine local_690;
  Twine local_678;
  Twine local_660;
  StringRef local_648;
  undefined1 local_638 [8];
  SmallString<256U> dir;
  AssertHelper local_508;
  Message local_500;
  bool local_4f1;
  undefined1 local_4f0 [8];
  AssertionResult gtest_ar_;
  undefined1 local_4d0 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_458;
  Twine local_440;
  Twine local_428;
  StringRef local_410;
  undefined1 local_400 [8];
  SmallString<256U> file;
  Twine local_2d8;
  Twine local_2c0;
  Twine local_2a8;
  string local_290;
  StringRef local_270;
  undefined1 local_260 [8];
  SmallString<256U> tempDir;
  undefined1 local_140 [8];
  TmpDir rootTempDir;
  FileSystemTest_testRecursiveRemoval_Test *this_local;
  Twine *pTVar7;
  
  rootTempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_140,stack0xfffffffffffffeb0);
  llbuild::TmpDir::str_abi_cxx11_(&local_290,(TmpDir *)local_140);
  uVar3 = std::__cxx11::string::data();
  local_270.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_270.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_260,local_270);
  std::__cxx11::string::~string((string *)&local_290);
  llvm::Twine::Twine(&local_2a8,"root");
  llvm::Twine::Twine(&local_2c0,"");
  llvm::Twine::Twine(&local_2d8,"");
  llvm::Twine::Twine((Twine *)(file.super_SmallVector<char,_256U>.
                               super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8),"");
  pTVar7 = &local_2a8;
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_260,pTVar7,&local_2c0,&local_2d8,
             (Twine *)(file.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                       InlineElts + 0xf8));
  _Var6 = (__mode_t)pTVar7;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_260);
  llbuild::basic::sys::mkdir(pcVar4,_Var6);
  local_410 = llvm::SmallString<256U>::str((SmallString<256U> *)local_260);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_400,local_410);
  llvm::Twine::Twine(&local_428,"test.txt");
  llvm::Twine::Twine(&local_440,"");
  llvm::Twine::Twine(&local_458,"");
  llvm::Twine::Twine((Twine *)&ec._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_400,&local_428,&local_440,&local_458,(Twine *)&ec._M_cat
            );
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_400);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_4d0,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  local_4f1 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4f0,&local_4f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (dir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts +
               0xf8),(internal *)local_4f0,(AssertionResult *)0x27eef0,"true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x4c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    std::__cxx11::string::~string
              ((string *)
               (dir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts +
               0xf8));
    testing::Message::~Message(&local_500);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f0);
  iVar2 = 0x27e85a;
  llvm::raw_ostream::operator<<((raw_ostream *)local_4d0,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_4d0,iVar2);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_4d0);
  local_648 = llvm::SmallString<256U>::str((SmallString<256U> *)local_260);
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_638,local_648);
  llvm::Twine::Twine(&local_660,"subdir");
  llvm::Twine::Twine(&local_678,"");
  llvm::Twine::Twine(&local_690,"");
  llvm::Twine::Twine(&local_6a8,"");
  pTVar7 = &local_660;
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_638,pTVar7,&local_678,&local_690,&local_6a8);
  _Var6 = (__mode_t)pTVar7;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_638);
  llbuild::basic::sys::mkdir(pcVar4,_Var6);
  llvm::Twine::Twine(&local_6c0,"file_in_subdir.txt");
  llvm::Twine::Twine(&local_6d8,"");
  llvm::Twine::Twine(&local_6f0,"");
  llvm::Twine::Twine((Twine *)&ec_1._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_638,&local_6c0,&local_6d8,&local_6f0,
             (Twine *)&ec_1._M_cat);
  std::error_code::error_code((error_code *)&os_1.SupportsSeeking);
  join_0x00000010_0x00000000_ = llvm::SmallString<256U>::str((SmallString<256U> *)local_638);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_768,join_0x00000010_0x00000000_,
             (error_code *)&os_1.SupportsSeeking,F_Text);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os_1.SupportsSeeking);
  local_789 = (bool)((bVar1 ^ 0xffU) & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_788,&local_789,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_788);
  if (!bVar1) {
    testing::Message::Message(&local_798);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&fs,(internal *)local_788,(AssertionResult *)0x27eef0,"true","false",in_R9)
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x59,pcVar4);
    testing::internal::AssertHelper::operator=(&local_7a0,&local_798);
    testing::internal::AssertHelper::~AssertHelper(&local_7a0);
    std::__cxx11::string::~string((string *)&fs);
    testing::Message::~Message(&local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_788);
  iVar2 = 0x27e85a;
  llvm::raw_ostream::operator<<((raw_ostream *)local_768,"Hello, world!");
  llvm::raw_fd_ostream::close((raw_fd_ostream *)local_768,iVar2);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_768);
  llbuild::basic::createLocalFileSystem();
  pFVar5 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)&stack0xfffffffffffff838);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_260);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7f0,pcVar4,
             (allocator *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  iVar2 = (*pFVar5->_vptr_FileSystem[5])(pFVar5,local_7f0);
  std::__cxx11::string::~string(local_7f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar__2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 7));
  local_7c9 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_808,&local_7c9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_810);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)(statbuf.__glibc_reserved + 2),(internal *)local_808,
               (AssertionResult *)0x291ef6,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0x60,pcVar4);
    testing::internal::AssertHelper::operator=(&local_818,&local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    std::__cxx11::string::~string((string *)(statbuf.__glibc_reserved + 2));
    testing::Message::~Message(&local_810);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  local_8e0[1] = 0xffffffff;
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_260);
  local_8e0[0] = llbuild::basic::sys::stat(pcVar4,(stat *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_8d8,"-1","sys::stat(tempDir.c_str(), &statbuf)",local_8e0 + 1,
             local_8e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar1) {
    testing::Message::Message(&local_8e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,99,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_8e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_8e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  local_904 = 2;
  rhs = __errno_location();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_900,"2","(*__errno_location ())",&local_904,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_900);
  if (!bVar1) {
    testing::Message::Message(&local_910);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_900);
    testing::internal::AssertHelper::AssertHelper
              (&local_918,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,100,pcVar4);
    testing::internal::AssertHelper::operator=(&local_918,&local_910);
    testing::internal::AssertHelper::~AssertHelper(&local_918);
    testing::Message::~Message(&local_910);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_900);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               *)&stack0xfffffffffffff838);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_638);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_400);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_260);
  llbuild::TmpDir::~TmpDir((TmpDir *)local_140);
  return;
}

Assistant:

TEST(FileSystemTest, testRecursiveRemoval) {
  TmpDir rootTempDir(__func__);

  SmallString<256> tempDir { rootTempDir.str() };
  llvm::sys::path::append(tempDir, "root");
  sys::mkdir(tempDir.c_str());

  SmallString<256> file{ tempDir.str() };
  llvm::sys::path::append(file, "test.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(file.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  SmallString<256> dir{ tempDir.str() };
  llvm::sys::path::append(dir, "subdir");
  sys::mkdir(dir.c_str());

  llvm::sys::path::append(dir, "file_in_subdir.txt");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(dir.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto fs = createLocalFileSystem();
  bool result = fs->remove(tempDir.c_str());
  EXPECT_TRUE(result);

  sys::StatStruct statbuf;
  EXPECT_EQ(-1, sys::stat(tempDir.c_str(), &statbuf));
  EXPECT_EQ(ENOENT, errno);
}